

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_file_tests.cpp
# Opt level: O0

void __thiscall
iu_FileSystemTest_x_iutest_x_FileSize64bit_Test::Body
          (iu_FileSystemTest_x_iutest_x_FileSize64bit_Test *this)

{
  bool bVar1;
  ParamType *pPVar2;
  char *pcVar3;
  char *in_R9;
  AssertionHelper local_620;
  Fixed local_5f0;
  iu_uint_max_t local_468;
  undefined1 local_460 [8];
  AssertionResult iutest_ar_2;
  AssertionHelper local_418;
  Fixed local_3e8;
  bool local_259;
  undefined1 local_258 [8];
  AssertionResult iutest_ar_1;
  StdioFile file;
  AssertionHelper local_210;
  Fixed local_1e0;
  unsigned_long local_48;
  undefined1 local_40 [8];
  AssertionResult iutest_ar;
  uintmax_t expectedSize;
  iu_FileSystemTest_x_iutest_x_FileSize64bit_Test *this_local;
  
  pPVar2 = iutest::WithParamInterface<unsigned_long>::GetParam();
  iutest_ar._32_8_ = *pPVar2;
  iutest::detail::AlwaysZero();
  local_48 = std::filesystem::file_size(&largefile_abi_cxx11_);
  iutest::internal::backward::EqHelper<false>::Compare<unsigned_long>
            ((AssertionResult *)local_40,"expectedSize","::std::filesystem::file_size(largefile)",
             (unsigned_long *)&iutest_ar.m_result,&local_48);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    memset(&local_1e0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1e0);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_40);
    iutest::AssertionHelper::AssertionHelper
              (&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
               ,0x67,pcVar3,kAssumeFailure);
    iutest::AssertionHelper::operator=(&local_210,&local_1e0);
    iutest::AssertionHelper::~AssertionHelper(&local_210);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1e0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  if (bVar1) {
    iutest::StdioFile::StdioFile((StdioFile *)&iutest_ar_1.m_result);
    iutest::detail::AlwaysZero();
    local_259 = iutest::IFile::Open((IFile *)&iutest_ar_1.m_result,&largefile_abi_cxx11_,1);
    iutest::AssertionResult::Is<bool>((AssertionResult *)local_258,&local_259);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
    if (!bVar1) {
      memset(&local_3e8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3e8);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                ((string *)&iutest_ar_2.m_result,(internal *)local_258,
                 (AssertionResult *)"file.Open(largefile, iutest::IFile::OpenRead)","false","true",
                 in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iutest::AssertionHelper::AssertionHelper
                (&local_418,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
                 ,0x6a,pcVar3,kFatalFailure);
      iutest::AssertionHelper::operator=(&local_418,&local_3e8);
      iutest::AssertionHelper::~AssertionHelper(&local_418);
      std::__cxx11::string::~string((string *)&iutest_ar_2.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3e8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_258);
    if (bVar1) {
      iutest::detail::AlwaysZero();
      local_468 = iutest::StdioFile::GetSize((StdioFile *)&iutest_ar_1.m_result);
      iutest::internal::backward::EqHelper<false>::Compare<unsigned_long>
                ((AssertionResult *)local_460,"expectedSize","file.GetSize()",
                 (unsigned_long *)&iutest_ar.m_result,&local_468);
      bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_460);
      if (!bVar1) {
        memset(&local_5f0,0,0x188);
        iutest::AssertionHelper::Fixed::Fixed(&local_5f0);
        pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_460);
        iutest::AssertionHelper::AssertionHelper
                  (&local_620,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
                   ,0x6c,pcVar3,kNonFatalFailure);
        iutest::AssertionHelper::operator=(&local_620,&local_5f0);
        iutest::AssertionHelper::~AssertionHelper(&local_620);
        iutest::AssertionHelper::Fixed::~Fixed(&local_5f0);
      }
      iutest::AssertionResult::~AssertionResult((AssertionResult *)local_460);
    }
    iutest::StdioFile::~StdioFile((StdioFile *)&iutest_ar_1.m_result);
  }
  return;
}

Assistant:

IUTEST_P(FileSystemTest, FileSize64bit)
{
    const uintmax_t expectedSize = GetParam();
    IUTEST_ASSUME_EQ(expectedSize, ::std::filesystem::file_size(largefile));

    ::iutest::StdioFile file;
    IUTEST_ASSERT_TRUE( file.Open(largefile, iutest::IFile::OpenRead) );
#if IUTEST_HAS_FILENO && IUTEST_HAS_FILE_STAT
    IUTEST_EXPECT_EQ(expectedSize, file.GetSize());
#else
    IUTEST_INFORM_EQ(expectedSize, file.GetSize());
#endif
}